

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O3

Status __thiscall leveldb::log::LogTest::StringDest::Append(StringDest *this,Slice *slice)

{
  ulong *in_RDX;
  
  std::__cxx11::string::append((char *)&slice->size_,*in_RDX);
  (this->super_WritableFile)._vptr_WritableFile = (_func_int **)0x0;
  return (Status)(char *)this;
}

Assistant:

Status Append(const Slice& slice) override {
      contents_.append(slice.data(), slice.size());
      return Status::OK();
    }